

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QDateTimeParser::SectionNode,QDateTimeParser::SectionNode>
                    (QList<QDateTimeParser::SectionNode> *vector,SectionNode *u,qsizetype from)

{
  undefined4 uVar1;
  ulong uVar2;
  SectionNode *pSVar3;
  undefined4 uVar4;
  char cVar5;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  SectionNode SVar11;
  
  uVar2 = (vector->d).size;
  uVar6 = from;
  if (from < 0) {
    uVar6 = from + uVar2;
    if ((long)(from + uVar2) < 1) {
      uVar6 = 0;
    }
  }
  lVar10 = -1;
  if (uVar6 < uVar2) {
    pSVar3 = (vector->d).ptr;
    piVar7 = &pSVar3[uVar6].count;
    lVar8 = uVar2 * 0x10 + uVar6 * -0x10;
    lVar10 = 0x10 - (long)(pSVar3 + uVar6);
    do {
      lVar9 = lVar10;
      if (lVar8 == 0) {
        return -1;
      }
      uVar1 = ((SectionNode *)(piVar7 + -2))->type;
      uVar4 = ((SectionNode *)(piVar7 + -2))->pos;
      SVar11.pos = uVar4;
      SVar11.type = uVar1;
      SVar11._8_8_ = *(undefined8 *)piVar7;
      cVar5 = ::operator==(SVar11,*u);
      piVar7 = piVar7 + 4;
      lVar8 = lVar8 + -0x10;
      lVar10 = lVar9 + -0x10;
    } while (cVar5 == '\0');
    lVar10 = -((long)&(vector->d).ptr[-1].type + lVar9) >> 4;
  }
  return lVar10;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}